

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<int>::test_pow2_numerators<(libdivide::Branching)0>
          (DivideTest<int> *this,int denom,divider<int,_(libdivide::Branching)0> *the_divider)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int numer;
  
  for (uVar1 = 1; uVar1 != 0x1f; uVar1 = uVar1 + 1) {
    iVar3 = 1 << (uVar1 & 0x1f);
    numer = 1 - iVar3;
    for (iVar2 = -1; iVar2 != 2; iVar2 = iVar2 + 1) {
      test_one<(libdivide::Branching)0>(this,iVar3 + iVar2,denom,the_divider);
      test_one<(libdivide::Branching)0>(this,numer,denom,the_divider);
      numer = numer + -1;
    }
  }
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }